

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOBuildFmsMetaData(FmsMetaData md,FmsIOMetaDataInfo *minfo)

{
  FmsMetaData in_RSI;
  char *in_RDI;
  FmsIOMetaDataInfo *mds;
  FmsMetaData *child;
  FmsInt i;
  void *data_1;
  void *data;
  char *in_stack_ffffffffffffffc8;
  long lVar1;
  char *in_stack_ffffffffffffffd0;
  ulong uVar2;
  FmsMetaData in_stack_ffffffffffffffd8;
  void *pvVar3;
  FmsIOMetaDataInfo *in_stack_ffffffffffffffe0;
  FmsScalarType scal_type;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar4;
  
  if (in_RDI == (char *)0x0) {
    iVar4 = 1;
  }
  else if (in_RSI == (FmsMetaData)0x0) {
    iVar4 = 2;
  }
  else {
    scal_type = (FmsScalarType)((ulong)in_RSI >> 0x20);
    switch(in_RSI->md_type) {
    case FMS_INTEGER:
      pvVar3 = (void *)0x0;
      FmsMetaDataSetIntegers
                ((FmsMetaData)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 scal_type,0,(void **)in_stack_ffffffffffffffd8);
      if (pvVar3 == (void *)0x0) {
        return 3;
      }
      memcpy(pvVar3,in_RSI->data,FmsIntTypeSize[(in_RSI->sub_type).int_type] * in_RSI->num_entries);
      break;
    case FMS_SCALAR:
      pvVar3 = (void *)0x0;
      FmsMetaDataSetScalars
                ((FmsMetaData)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 scal_type,(FmsInt)in_stack_ffffffffffffffe0,(void **)0x0);
      if (pvVar3 == (void *)0x0) {
        return 4;
      }
      memcpy(pvVar3,in_RSI->data,
             FmsScalarTypeSize[(in_RSI->sub_type).int_type] * in_RSI->num_entries);
      break;
    case FMS_STRING:
      FmsMetaDataSetString
                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      break;
    case FMS_META_DATA:
      lVar1 = 0;
      FmsMetaDataSetMetaData
                ((FmsMetaData)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                 (FmsInt)in_RSI,(FmsMetaData **)in_stack_ffffffffffffffe0);
      if (lVar1 == 0) {
        return 5;
      }
      for (uVar2 = 0; uVar2 < in_RSI->num_entries; uVar2 = uVar2 + 1) {
        FmsIOBuildFmsMetaData(in_RSI,in_stack_ffffffffffffffe0);
      }
      break;
    default:
      return 6;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int
FmsIOBuildFmsMetaData(FmsMetaData md, FmsIOMetaDataInfo *minfo) {
  if(!md) E_RETURN(1);
  if(!minfo) E_RETURN(2);
  switch(minfo->mdtype) {
  case FMS_INTEGER: {
    void *data = NULL;
    FmsMetaDataSetIntegers(md, minfo->name, minfo->subtype.i_type, minfo->size,
                           &data);
    if(data)
      memcpy(data, minfo->data,
             FmsIntTypeSize[minfo->subtype.i_type]*minfo->size);
    else
      E_RETURN(3);
    break;
  }
  case FMS_SCALAR: {
    void *data = NULL;
    FmsMetaDataSetScalars(md, minfo->name, minfo->subtype.s_type, minfo->size,
                          &data);
    if(data)
      memcpy(data, minfo->data,
             FmsScalarTypeSize[minfo->subtype.s_type]*minfo->size);
    else
      E_RETURN(4);
    break;
  }
  case FMS_STRING:
    FmsMetaDataSetString(md, minfo->name, (const char*)minfo->data);
    break;
  case FMS_META_DATA: {
    /* New scope */
    FmsInt i;
    FmsMetaData *child = NULL;
    FmsIOMetaDataInfo *mds = (FmsIOMetaDataInfo*)minfo->data;
    FmsMetaDataSetMetaData(md, minfo->name, minfo->size, &child);
    if(child) {
      for(i = 0; i < minfo->size; ++i)
        FmsIOBuildFmsMetaData(child[i], &mds[i]);
    } else
      E_RETURN(5);
  }
  break;
  default:
    // Corrupt mdtype
    E_RETURN(6);
    break;
  }
  return 0;
}